

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O1

void Eigen::internal::
     Assignment<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::swap_assign_op<double>,_Eigen::internal::Dense2Triangular,_void>
     ::run(TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U> *dst,
          Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *src,swap_assign_op<double> *func)

{
  double dVar1;
  non_const_type pMVar2;
  MatrixTypeNested pMVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  
  pMVar2 = src->m_matrix;
  pMVar3 = dst->m_matrix;
  lVar4 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows;
  if (lVar4 == (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols) {
    lVar5 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    lVar6 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols;
    if (lVar6 == lVar5) {
      if (0 < lVar6) {
        pdVar8 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        pdVar9 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        lVar10 = 0;
        do {
          lVar11 = lVar10;
          if (lVar4 < lVar10) {
            lVar11 = lVar4;
          }
          if (0 < lVar11) {
            lVar7 = 0;
            pdVar12 = pdVar8;
            do {
              dVar1 = pdVar9[lVar7];
              pdVar9[lVar7] = *pdVar12;
              *pdVar12 = dVar1;
              lVar7 = lVar7 + 1;
              pdVar12 = pdVar12 + lVar5;
            } while (lVar11 != lVar7);
          }
          lVar10 = lVar10 + 1;
          pdVar8 = pdVar8 + 1;
          pdVar9 = pdVar9 + lVar4;
        } while (lVar10 != lVar6);
      }
      return;
    }
  }
  __assert_fail("rows==this->rows() && cols==this->cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/TriangularMatrix.h"
                ,0x48,
                "void Eigen::TriangularBase<Eigen::TriangularView<Eigen::Matrix<double, -1, -1>, 10>>::resize(Index, Index) [Derived = Eigen::TriangularView<Eigen::Matrix<double, -1, -1>, 10>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
    inline Scalar coeff(Index row, Index col) const  { return derived().coeff(row,col); }